

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O1

void __thiscall Merge::inflate(Merge *this,Varnode *a,HighVariable *high)

{
  HighVariable *pHVar1;
  pointer ppVVar2;
  long lVar3;
  
  pHVar1 = Varnode::getHigh(a);
  updateHigh(this,pHVar1);
  updateHigh(this,high);
  ppVVar2 = (high->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(high->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2) >> 3)) {
    lVar3 = 0;
    do {
      Cover::merge(a->cover,ppVVar2[lVar3]->cover);
      lVar3 = lVar3 + 1;
      ppVVar2 = (high->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(high->inst).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2)
                          >> 3));
  }
  pHVar1 = Varnode::getHigh(a);
  *(byte *)&pHVar1->highflags = (byte)pHVar1->highflags | 4;
  return;
}

Assistant:

void Merge::inflate(Varnode *a,HighVariable *high)

{
  updateHigh(a->getHigh());
  updateHigh(high);
  for(int4 i=0;i<high->numInstances();++i) {
    Varnode *b = high->getInstance(i);
    a->cover->merge(*b->cover);
  }
  a->getHigh()->coverDirty();
}